

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.c
# Opt level: O2

void nsync::nsync_mu_runlock(nsync_mu *mu)

{
  uint uVar1;
  bool bVar2;
  
  LOCK();
  bVar2 = (mu->word).super___atomic_base<unsigned_int>._M_i == 0x100;
  if (bVar2) {
    (mu->word).super___atomic_base<unsigned_int>._M_i = 0;
  }
  UNLOCK();
  if (bVar2) {
    return;
  }
  uVar1 = (mu->word).super___atomic_base<unsigned_int>._M_i;
  if ((uVar1 & 0xffffff01) == 1) {
    nsync_panic_("attempt to nsync_mu_runlock() an nsync_mu held in write mode\n");
    return;
  }
  if ((uVar1 & 0xffffff8c) != 0x104) {
    LOCK();
    bVar2 = uVar1 == (mu->word).super___atomic_base<unsigned_int>._M_i;
    if (bVar2) {
      (mu->word).super___atomic_base<unsigned_int>._M_i = uVar1 - 0x100;
    }
    UNLOCK();
    if (bVar2) {
      return;
    }
  }
  nsync_mu_unlock_slow_(mu,(lock_type *)nsync_reader_type_);
  return;
}

Assistant:

void nsync_mu_runlock (nsync_mu *mu) {
	RWLOCK_RELEASE (mu, 0);
	IGNORE_RACES_START ();
	/* See comment in nsync_mu_unlock(). */
	if (!ATM_CAS_REL (&mu->word, MU_RLOCK, 0)) {
		uint32_t old_word = ATM_LOAD (&mu->word);
                /* Sanity check:  mutex must not be held in write mode and
                   reader count must not be 0.  */
		if (((old_word ^ MU_WLOCK) & (MU_WLOCK | MU_RLOCK_FIELD)) == 0) {
			if ((old_word & MU_WLOCK) != 0) {
				nsync_panic_ ("attempt to nsync_mu_runlock() an nsync_mu "
				       "held in write mode\n");
			} else {
				nsync_panic_ ("attempt to nsync_mu_runlock() an nsync_mu "
				       "not held in read mode\n");
			}
		} else if ((old_word & (MU_WAITING | MU_DESIG_WAKER)) == MU_WAITING &&
			    (old_word & (MU_RLOCK_FIELD|MU_ALL_FALSE)) == MU_RLOCK) {
                        /* There are waiters and no designated waker, the last
                           reader is unlocking, and not all waiters have a
                           false condition.  So we must take the slow path to
                           attempt to wake a waiter.  */
			nsync_mu_unlock_slow_ (mu, nsync_reader_type_);
		} else if (!ATM_CAS_REL (&mu->word, old_word, old_word - MU_RLOCK)) {
			/* CAS attempt failed, so take slow path. */
			nsync_mu_unlock_slow_ (mu, nsync_reader_type_);
		}
	}
	IGNORE_RACES_END ();
}